

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

void cf2_getScaleAndHintFlag
               (PS_Decoder *decoder,CF2_F16Dot16 *x_scale,CF2_F16Dot16 *y_scale,FT_Bool *hinted,
               FT_Bool *scaled)

{
  FT_Bool *scaled_local;
  FT_Bool *hinted_local;
  CF2_F16Dot16 *y_scale_local;
  CF2_F16Dot16 *x_scale_local;
  PS_Decoder *decoder_local;
  
  *hinted = ((decoder->builder).glyph)->hint;
  *scaled = ((decoder->builder).glyph)->scaled;
  if (*hinted == '\0') {
    *x_scale = 0x400;
    *y_scale = 0x400;
  }
  else {
    *x_scale = ((int)((decoder->builder).glyph)->x_scale + 0x20) / 0x40;
    *y_scale = ((int)((decoder->builder).glyph)->y_scale + 0x20) / 0x40;
  }
  return;
}

Assistant:

static void
  cf2_getScaleAndHintFlag( PS_Decoder*  decoder,
                           CF2_Fixed*   x_scale,
                           CF2_Fixed*   y_scale,
                           FT_Bool*     hinted,
                           FT_Bool*     scaled )
  {
    FT_ASSERT( decoder && decoder->builder.glyph );

    /* note: FreeType scale includes a factor of 64 */
    *hinted = decoder->builder.glyph->hint;
    *scaled = decoder->builder.glyph->scaled;

    if ( *hinted )
    {
      *x_scale = ADD_INT32( decoder->builder.glyph->x_scale, 32 ) / 64;
      *y_scale = ADD_INT32( decoder->builder.glyph->y_scale, 32 ) / 64;
    }
    else
    {
      /* for unhinted outlines, `cff_slot_load' does the scaling, */
      /* thus render at `unity' scale                             */

      *x_scale = 0x0400;   /* 1/64 as 16.16 */
      *y_scale = 0x0400;
    }
  }